

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Choice.cpp
# Opt level: O2

VirtualIterator<Kernel::Clause_*> __thiscall
Inferences::Choice::ResultFn::operator()(ResultFn *this,Term *term)

{
  TermList op;
  uint uVar1;
  Term *in_RDX;
  SingletonIterator<Kernel::Clause_*> it;
  AxiomsIterator local_70;
  
  uVar1 = *(uint *)&in_RDX->field_0xc & 0xfffffff;
  op._content = in_RDX->_args[(ulong)uVar1 - 2]._content;
  if ((op._content & 1) == 0) {
    createChoiceAxiom(op,(TermList)in_RDX->_args[(ulong)uVar1 - 3]._content);
    *(int *)(DAT_00a141a0 + 0x108) = *(int *)(DAT_00a141a0 + 0x108) + 1;
    it._el = (Clause *)0x0;
    it._0_8_ = this;
    Lib::pvi<Lib::SingletonIterator<Kernel::Clause*>>(it);
  }
  else {
    AxiomsIterator::AxiomsIterator(&local_70,in_RDX);
    Lib::pvi<Inferences::Choice::AxiomsIterator>((Lib *)this,&local_70);
    Lib::DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
              ((DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2> *)
               &local_70);
  }
  return (VirtualIterator<Kernel::Clause_*>)(IteratorCore<Kernel::Clause_*> *)this;
}

Assistant:

VirtualIterator<Clause*> operator() (Term* term){
    TermList op = *term->nthArgument(2);
    if(op.isVar()){
      return pvi(AxiomsIterator(term));
    } else {
      Clause* axiom = createChoiceAxiom(op, *term->nthArgument(3));
      env.statistics->choiceInstances++;
      return pvi(getSingletonIterator(axiom));
    }
  }